

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteSparse_config.c
# Opt level: O0

void * SuiteSparse_malloc(size_t nitems,size_t size_of_item)

{
  size_t sVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t size;
  void *p;
  void *local_18;
  long local_10;
  long local_8;
  
  local_8 = in_RDI;
  if (in_RDI == 0) {
    local_8 = 1;
  }
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_10 = 1;
  }
  sVar1 = local_8 * local_10;
  auVar3._8_4_ = (int)(sVar1 >> 0x20);
  auVar3._0_8_ = sVar1;
  auVar3._12_4_ = 0x45300000;
  dVar2 = (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  auVar5._8_4_ = (int)((ulong)local_8 >> 0x20);
  auVar5._0_8_ = local_8;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = (int)((ulong)local_10 >> 0x20);
  auVar6._0_8_ = local_10;
  auVar6._12_4_ = 0x45300000;
  dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_8) - 4503599627370496.0)) *
          ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0));
  if ((dVar2 != dVar4) || (NAN(dVar2) || NAN(dVar4))) {
    local_18 = (void *)0x0;
  }
  else {
    local_18 = (*SuiteSparse_config.malloc_func)(sVar1);
  }
  return local_18;
}

Assistant:

void *SuiteSparse_malloc    /* pointer to allocated block of memory */
(
    size_t nitems,          /* number of items to malloc */
    size_t size_of_item     /* sizeof each item */
)
{
    void *p ;
    size_t size ;
    if (nitems < 1) nitems = 1 ;
    if (size_of_item < 1) size_of_item = 1 ;
    size = nitems * size_of_item  ;

    if (size != ((c_float) nitems) * size_of_item)
    {
        /* size_t overflow */
        p = NULL ;
    }
    else
    {
        p = (void *) (SuiteSparse_config.malloc_func) (size) ;
        // p = (void *) c_malloc(size) ;
    }
    return (p) ;
}